

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O3

void __thiscall
BitSetImplement<std::bitset<16000UL>,_KDefectiveRDS>::__init__
          (BitSetImplement<std::bitset<16000UL>,_KDefectiveRDS> *this,void *P,void *C)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  memset(P,0,2000);
  uVar2 = (ulong)(this->super_KDefectiveRDS).super_KDefectiveBase.size;
  if (0 < (long)uVar2) {
    uVar3 = 0;
    do {
      if (uVar3 == 16000) {
        std::__throw_out_of_range_fmt
                  ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",16000,16000);
      }
      puVar1 = (ulong *)((long)C + (uVar3 >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return;
}

Assistant:

void BitSetImplement<Bitset, Base>::__init__(void *P, void *C) {
	Bitset *__P__ = (Bitset*) P, *__C__ = (Bitset*) C;
	__P__ -> reset(); 
	for (int i = 0; i < size; i++) __C__ -> set(i);
}